

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

ostream * operator<<(ostream *o,Address *a)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"country: ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(a->country)._M_dataplus._M_p,(a->country)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", city: ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(a->city)._M_dataplus._M_p,(a->city)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", street: ",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(a->street)._M_dataplus._M_p,(a->street)._M_string_length);
  return o;
}

Assistant:

ostream& operator <<(ostream& o, const Address& a) {

    o << "country: " << a.getCountry() << ", city: " << a.getCity() << ", street: " << a.getStreet();
    return o;
}